

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_utils.h
# Opt level: O2

char * pcp_strndup(char *s,size_t size)

{
  void *pvVar1;
  char *__dest;
  size_t sVar2;
  
  pvVar1 = memchr(s,0,size);
  sVar2 = (long)pvVar1 - (long)s;
  if (pvVar1 == (void *)0x0) {
    sVar2 = size;
  }
  __dest = (char *)malloc(sVar2 + 1);
  if (__dest != (char *)0x0) {
    memcpy(__dest,s,sVar2 + 1);
    __dest[sVar2] = '\0';
  }
  return __dest;
}

Assistant:

static inline char *pcp_strndup(const char *s, size_t size) {
    char *ret;
    char *end = memchr(s, 0, size);

    if (end) {
        /* Length + 1 */
        size = end - s + 1;
    } else {
        size++;
    }
    ret = malloc(size);

    if (ret) {
        memcpy(ret, s, size);
        ret[size - 1] = '\0';
    }
    return ret;
}